

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O3

char * archive_entry_copy_fflags_text(archive_entry *entry,char *flags)

{
  undefined1 auVar1 [16];
  byte bVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  size_t sVar7;
  byte *pbVar8;
  char *__s;
  unsigned_long *puVar9;
  size_t __n;
  byte *pbVar10;
  undefined1 auVar11 [16];
  undefined1 local_48 [16];
  
  archive_mstring_copy_mbs(&entry->ae_fflags_text,flags);
  do {
    bVar2 = *flags;
    uVar6 = (ulong)bVar2;
    if (bVar2 < 0x20) {
      if (bVar2 != 9) {
        if (bVar2 == 0) {
          local_48 = (undefined1  [16])0x0;
          pbVar8 = (byte *)0x0;
          goto LAB_0074f3b7;
        }
LAB_0074f2a3:
        local_48 = (undefined1  [16])0x0;
        pbVar8 = (byte *)0x0;
        do {
          __n = 0;
          while ((0x2c < (byte)uVar6 || ((0x100100000201U >> (uVar6 & 0x3f) & 1) == 0))) {
            lVar4 = __n + 1;
            __n = __n + 1;
            uVar6 = (ulong)((byte *)flags)[lVar4];
          }
          pbVar10 = (byte *)flags + __n;
          puVar9 = &fileflags[0].set;
          __s = "nosappnd";
          do {
            sVar7 = strlen(__s);
            if ((sVar7 == __n) && (iVar5 = bcmp(flags,__s,__n), iVar5 == 0)) {
              auVar1 = *(undefined1 (*) [16])puVar9;
              auVar11._0_8_ = auVar1._8_8_;
              auVar11._8_4_ = auVar1._0_4_;
              auVar11._12_4_ = auVar1._4_4_;
LAB_0074f368:
              local_48 = local_48 | auVar11;
              bVar3 = false;
              goto LAB_0074f389;
            }
            if ((sVar7 - 2 == __n) && (iVar5 = bcmp(flags,__s + 2,__n), iVar5 == 0)) {
              auVar11 = *(undefined1 (*) [16])puVar9;
              goto LAB_0074f368;
            }
            __s = *(char **)*(undefined1 (*) [16])(puVar9 + 2);
            puVar9 = puVar9 + 4;
          } while (__s != (char *)0x0);
          bVar3 = true;
LAB_0074f389:
          while( true ) {
            uVar6 = (ulong)*pbVar10;
            if ((0x2c < uVar6) || ((0x100100000200U >> (uVar6 & 0x3f) & 1) == 0)) break;
            pbVar10 = pbVar10 + 1;
          }
          if (pbVar8 != (byte *)0x0) {
            flags = (char *)pbVar8;
          }
          if (bVar3) {
            pbVar8 = (byte *)flags;
          }
          flags = (char *)pbVar10;
        } while (*pbVar10 != 0);
LAB_0074f3b7:
        entry->ae_fflags_set = local_48._0_8_;
        entry->ae_fflags_clear = local_48._8_8_;
        return (char *)pbVar8;
      }
    }
    else if ((bVar2 != 0x20) && (bVar2 != 0x2c)) goto LAB_0074f2a3;
    flags = (char *)((byte *)flags + 1);
  } while( true );
}

Assistant:

const char *
archive_entry_copy_fflags_text(struct archive_entry *entry,
    const char *flags)
{
	archive_mstring_copy_mbs(&entry->ae_fflags_text, flags);
	return (ae_strtofflags(flags,
		    &entry->ae_fflags_set, &entry->ae_fflags_clear));
}